

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_GiveToChildren
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  AActor *receiver;
  AActor *pAVar5;
  char *__assertion;
  VMReturn *in_R9;
  AActor *pAVar6;
  bool bVar7;
  TThinkerIterator<AActor> it;
  int in_stack_ffffffffffffffa8;
  FThinkerIterator local_48;
  PClass *pPVar4;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003d1030;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar6 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar6 != (AActor *)0x0) {
        pPVar4 = (pAVar6->super_DThinker).super_DObject.Class;
        if (pPVar4 == (PClass *)0x0) {
          iVar2 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
          pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
          (pAVar6->super_DThinker).super_DObject.Class = pPVar4;
        }
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar1 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar1) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d1030;
        }
        goto LAB_003d0f66;
      }
    }
    else if (pAVar6 != (AActor *)0x0) goto LAB_003d1020;
    pAVar6 = (AActor *)0x0;
LAB_003d0f66:
    FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
    receiver = (AActor *)FThinkerIterator::Next(&local_48,false);
    iVar2 = 0;
    if (receiver != (AActor *)0x0) {
      iVar2 = 0;
      do {
        pAVar5 = (receiver->master).field_0.p;
        if (pAVar5 == (AActor *)0x0) {
LAB_003d0fba:
          pAVar5 = (AActor *)0x0;
        }
        else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (receiver->master).field_0.p = (AActor *)0x0;
          goto LAB_003d0fba;
        }
        if (pAVar5 == pAVar6) {
          bVar7 = DoGiveInventory(receiver,true,param,
                                  (TArray<VMValue,_VMValue> *)defaultparam->Array,numparam,in_R9,
                                  in_stack_ffffffffffffffa8);
          iVar2 = iVar2 + (uint)bVar7;
        }
        receiver = (AActor *)FThinkerIterator::Next(&local_48,false);
      } while (receiver != (AActor *)0x0);
    }
    iVar3 = 0;
    if (0 < numret) {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x993,
                      "int AF_AActor_A_GiveToChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (ret->RegType != '\0') {
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                      ,0x13f,"void VMReturn::SetInt(int)");
      }
      *(int *)ret->Location = iVar2;
      iVar3 = 1;
    }
    return iVar3;
  }
LAB_003d1020:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003d1030:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x986,
                "int AF_AActor_A_GiveToChildren(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GiveToChildren)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<AActor> it;
	AActor *mo;
	int count = 0;

	while ((mo = it.Next()))
	{
		if (mo->master == self)
		{
			count += DoGiveInventory(mo, true, VM_ARGS_NAMES);
		}
	}
	ACTION_RETURN_INT(count);
}